

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O2

bool __thiscall cppcms::impl::cgi::fastcgi::parse_pairs(fastcgi *this)

{
  uchar *e;
  uchar *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  char *key;
  char *value;
  uchar *p;
  uchar *local_48;
  string_pool *local_40;
  string_map *local_38;
  
  local_48 = (uchar *)(this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
  e = (uchar *)(this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
  local_40 = &(this->super_connection).pool_;
  local_38 = &(this->super_connection).env_;
  while (puVar1 = local_48, local_48 < e) {
    uVar2 = read_len(this,&local_48,e);
    uVar3 = read_len(this,&local_48,e);
    if ((uVar2 == 0xffffffff) || (uVar3 == 0xffffffff)) break;
    if ((uint)((int)e - (int)local_48) < uVar2) break;
    key = string_pool::add(local_40,(char *)local_48,(ulong)uVar2);
    local_48 = local_48 + uVar2;
    if ((uint)((int)e - (int)local_48) < uVar3) break;
    value = string_pool::add(local_40,(char *)local_48,(ulong)uVar3);
    local_48 = local_48 + uVar3;
    string_map::add(local_38,key,value);
  }
  return e <= puVar1;
}

Assistant:

bool parse_pairs()
		{
			unsigned char const *p=reinterpret_cast<unsigned char const *>(&body_.front());
			unsigned char const *e=p + body_.size();
			while(p<e) {
				uint32_t nlen=read_len(p,e);
				uint32_t vlen=read_len(p,e);
				if(nlen == 0xFFFFFFFFu || vlen == 0xFFFFFFFFu)
					return false;
				char *name=0;
				if(uint32_t(e - p) >= nlen) { // don't chage order -- prevent integer overflow
					name = pool_.add(reinterpret_cast<char const *>(p),nlen);
					p+=nlen;
				}
				else {
					return false;
				}
				char *value = 0;
				if(uint32_t(e - p) >= vlen) { // don't chage order -- prevent integer overflow
					value = pool_.add(reinterpret_cast<char const *>(p),vlen);
					p+=vlen;
				}
				else {
					return false;
				}
				env_.add(name,value);
			}
			return true;
		}